

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxSequence::Resolve(FxSequence *this,FCompileContext *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FxExpression **ppFVar4;
  undefined4 extraout_var;
  uint local_28;
  uint i;
  bool fail;
  FCompileContext *ctx_local;
  FxSequence *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    bVar1 = false;
    for (local_28 = 0;
        uVar2 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>),
        local_28 < uVar2; local_28 = local_28 + 1) {
      ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>,
                           (ulong)local_28);
      iVar3 = (*(*ppFVar4)->_vptr_FxExpression[2])(*ppFVar4,ctx);
      ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>,
                           (ulong)local_28);
      *ppFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
      if ((FxExpression *)CONCAT44(extraout_var,iVar3) == (FxExpression *)0x0) {
        bVar1 = true;
      }
      else {
        ppFVar4 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->Expressions).super_TArray<FxExpression_*,_FxExpression_*>,
                             (ulong)local_28);
        if ((*ppFVar4)->ValueType == &TypeError->super_PType) {
          FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Invalid statement")
          ;
          bVar1 = true;
        }
      }
    }
    if (bVar1) {
      if (this != (FxSequence *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSequence *)0x0;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxSequence::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	bool fail = false;
	for (unsigned i = 0; i < Expressions.Size(); ++i)
	{
		if (nullptr == (Expressions[i] = Expressions[i]->Resolve(ctx)))
		{
			fail = true;
		}
		else if (Expressions[i]->ValueType == TypeError)
		{
			ScriptPosition.Message(MSG_ERROR, "Invalid statement");
			fail = true;
		}
	}
	if (fail)
	{
		delete this;
		return nullptr;
	}
	return this;
}